

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BasicReporter::StartSection(BasicReporter *this,string *sectionName,string *param_2)

{
  SpanInfo SStack_38;
  
  SpanInfo::SpanInfo(&SStack_38,sectionName);
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  emplace_back<Catch::BasicReporter::SpanInfo>(&this->m_sectionSpans,&SStack_38);
  std::__cxx11::string::~string((string *)&SStack_38);
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& ) {
            m_sectionSpans.push_back( SpanInfo( sectionName ) );
        }